

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_String __thiscall
ON_String::HexadecimalFromBytes
          (ON_String *this,ON__UINT8 *bytes,size_t byte_count,bool bCapitalDigits,bool bReverse)

{
  bool bVar1;
  char *str;
  ON_String local_38;
  ON_String s;
  size_t s_length;
  bool bReverse_local;
  bool bCapitalDigits_local;
  size_t byte_count_local;
  ON__UINT8 *bytes_local;
  
  if ((bytes == (ON__UINT8 *)0x0) || (byte_count == 0)) {
    ON_String(this,&EmptyString);
  }
  else {
    s.m_s = (char *)(byte_count * 2);
    ON_String(&local_38);
    ReserveArray(&local_38,(size_t)s.m_s);
    SetLength(&local_38,(size_t)s.m_s);
    str = Array(&local_38);
    bVar1 = ON_BytesToHexadecimalString(bytes,byte_count,bCapitalDigits,bReverse,str,(size_t)s.m_s);
    if (bVar1) {
      ON_String(this,&local_38);
    }
    else {
      ON_String(this,&EmptyString);
    }
    ~ON_String(&local_38);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::HexadecimalFromBytes(
  const ON__UINT8* bytes,
  size_t byte_count,
  bool bCapitalDigits,
  bool bReverse
  )
{
  if (nullptr == bytes || byte_count <= 0)
    return ON_String::EmptyString;

  const size_t s_length = 2 * byte_count;
  ON_String s;
  s.ReserveArray(s_length);
  s.SetLength(s_length);
  if ( false == ON_BytesToHexadecimalString(bytes,byte_count,bCapitalDigits,bReverse,s.Array(),s_length) )
    return ON_String::EmptyString;

  return s;
}